

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall libcellml::Parser::~Parser(Parser *this)

{
  LoggerImpl *this_00;
  
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__Parser_002a0180;
  (this->super_Strict)._vptr_Strict = (_func_int **)&DAT_002a01a0;
  this_00 = Logger::pFunc(&this->super_Logger);
  if (this_00 != (LoggerImpl *)0x0) {
    Logger::LoggerImpl::~LoggerImpl(this_00);
  }
  operator_delete(this_00,0x70);
  Strict::~Strict(&this->super_Strict);
  Logger::~Logger(&this->super_Logger);
  return;
}

Assistant:

Parser::~Parser()
{
    delete pFunc();
}